

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O1

void VisualInfo(GLContext *ctx)

{
  GLContext *pGVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t __size;
  char *pcVar5;
  long lVar6;
  int value;
  int n_fbc;
  int value2;
  uint local_44;
  GLContext *local_40;
  int local_38;
  int local_34;
  
  local_40 = ctx;
  lVar3 = (*___glewXGetFBConfigs)(ctx->dpy,*(undefined4 *)(ctx->dpy + 0xe0),&local_38);
  if ((lVar3 != 0) && (verbose == 0)) {
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    if (0 < local_38) {
      lVar6 = 0;
      do {
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x8013,&local_44);
        if (iVar2 == 0) {
          fprintf((FILE *)file," |% 4d | ",(ulong)local_44);
        }
        else {
          fwrite("|  ?  |",7,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x8010,&local_44);
        if (iVar2 == 0) {
          if ((local_44 & 1) == 0) {
            if ((local_44 & 4) == 0) {
              if ((local_44 & 2) == 0) goto LAB_0010297f;
              pcVar5 = "pm ";
            }
            else {
              pcVar5 = "pb ";
            }
          }
          else if ((local_44 & 4) == 0) {
            pcVar5 = "wn ";
          }
          else {
            pcVar5 = "wp ";
          }
        }
        else {
LAB_0010297f:
          pcVar5 = " ? ";
        }
        fwrite(pcVar5,3,1,(FILE *)file);
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x8012,&local_44);
        if (iVar2 == 0) {
          pcVar5 = " y ";
          if (local_44 == 0) {
            pcVar5 = " n ";
          }
          fprintf((FILE *)file,pcVar5);
        }
        else {
          fwrite(" ? ",3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x22,&local_44);
        if (iVar2 == 0) {
          switch(local_44) {
          case 0x8002:
            pcVar5 = "tc ";
            break;
          case 0x8003:
            pcVar5 = "dc ";
            break;
          case 0x8004:
            pcVar5 = "pc ";
            break;
          case 0x8005:
            pcVar5 = "sc ";
            break;
          case 0x8006:
            pcVar5 = "gs ";
            break;
          case 0x8007:
            pcVar5 = "sg ";
            break;
          default:
            if (local_44 != 0x22) goto LAB_00102a3c;
            pcVar5 = " . ";
          }
        }
        else {
LAB_00102a3c:
          pcVar5 = " ? ";
        }
        fwrite(pcVar5,3,1,(FILE *)file);
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x8011,&local_44);
        if (iVar2 == 0) {
          if (__GLXEW_NV_float_buffer == '\0') {
            if ((local_44 >> 8 & 1) == 0) goto LAB_00102b24;
          }
          else {
            iVar2 = (*___glewXGetFBConfigAttrib)
                              (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x20b0,&local_34);
            if ((iVar2 != 0) || (local_34 != 1)) {
LAB_00102b24:
              if ((local_44 & 1) == 0) {
                if ((local_44 & 2) == 0) goto LAB_00102a70;
                pcVar5 = " c ";
              }
              else {
                pcVar5 = " i ";
              }
              goto LAB_00102b7c;
            }
          }
          pcVar5 = " f ";
        }
        else {
LAB_00102a70:
          pcVar5 = " ? ";
        }
LAB_00102b7c:
        fwrite(pcVar5,3,1,(FILE *)file);
        pGVar1 = local_40;
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),5,&local_44);
        uVar4 = 0x79;
        if (local_44 == 0) {
          uVar4 = 0x2e;
        }
        if (iVar2 != 0) {
          uVar4 = 0x3f;
        }
        fprintf((FILE *)file," %c ",(ulong)uVar4);
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (pGVar1->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),6,&local_44);
        uVar4 = 0x79;
        if (local_44 == 0) {
          uVar4 = 0x2e;
        }
        if (iVar2 != 0) {
          uVar4 = 0x3f;
        }
        fprintf((FILE *)file," %c ",(ulong)uVar4);
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (pGVar1->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),3,&local_44);
        if (iVar2 == 0) {
          fprintf((FILE *)file,"%2d ",(ulong)local_44);
        }
        else {
          fwrite(" ? ",3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x23,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0x8000) {
            pcVar5 = " . | ";
          }
          else if (local_44 == 0x8009) {
            pcVar5 = " i | ";
          }
          else {
            if (local_44 != 0x8008) goto LAB_00102c91;
            pcVar5 = " r | ";
          }
        }
        else {
LAB_00102c91:
          pcVar5 = " ? | ";
        }
        fwrite(pcVar5,5,1,(FILE *)file);
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),2,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102cda;
          }
          fprintf((FILE *)file,"%3d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102cda:
          fwrite(pcVar5,4,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),8,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102d6f;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102d6f:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),9,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102dc5;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102dc5:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),10,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102e1b;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102e1b:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0xb,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = " . | ";
            goto LAB_00102e75;
          }
          fprintf((FILE *)file,"%2d | ");
        }
        else {
          pcVar5 = " ? | ";
LAB_00102e75:
          fwrite(pcVar5,5,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),7,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102ecf;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102ecf:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0xc,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102f25;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102f25:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0xd,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = " . | ";
            goto LAB_00102f7f;
          }
          fprintf((FILE *)file,"%2d | ");
        }
        else {
          pcVar5 = " ? | ";
LAB_00102f7f:
          fwrite(pcVar5,5,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0xe,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00102fd9;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00102fd9:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0xf,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_0010302f;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_0010302f:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x10,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = "  . ";
            goto LAB_00103085;
          }
          fprintf((FILE *)file,"%2d ");
        }
        else {
          pcVar5 = "  ? ";
LAB_00103085:
          fwrite(pcVar5 + 1,3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x11,&local_44);
        if (iVar2 == 0) {
          if (local_44 == 0) {
            pcVar5 = " . | ";
            goto LAB_001030df;
          }
          fprintf((FILE *)file,"%2d | ");
        }
        else {
          pcVar5 = " ? | ";
LAB_001030df:
          fwrite(pcVar5,5,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x186a1,&local_44);
        if (iVar2 == 0) {
          fprintf((FILE *)file,"%2d ",(ulong)local_44);
        }
        else {
          fwrite(" ? ",3,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),100000,&local_44);
        if (iVar2 == 0) {
          fprintf((FILE *)file,"%2d | ",(ulong)local_44);
        }
        else {
          fwrite(" ? | ",5,1,(FILE *)file);
        }
        iVar2 = (*___glewXGetFBConfigAttrib)
                          (local_40->dpy,*(undefined8 *)(lVar3 + lVar6 * 8),0x20,&local_44);
        if (iVar2 == 0) {
          __size = 7;
          if (local_44 == 0x800d) {
            pcVar5 = "ncft |\n";
          }
          else if (local_44 == 0x8001) {
            pcVar5 = "slow |\n";
          }
          else if (local_44 == 0x8000) {
            pcVar5 = "none |\n";
          }
          else {
            pcVar5 = "???? |\n";
          }
        }
        else {
          __size = 6;
          pcVar5 = "???? |";
        }
        fwrite(pcVar5,__size,1,(FILE *)file);
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_38);
    }
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n"
           ,0x5d,1,(FILE *)file);
    fwrite(" +-----+-------------------------+-----------------+----------+-------------+-------+------+\n"
           ,0x5d,1,(FILE *)file);
  }
  return;
}

Assistant:

void
VisualInfo (GLContext* ctx)
{
  int n_fbc;
  GLXFBConfig* fbc;
  int value, ret, i;

  fbc = glXGetFBConfigs(ctx->dpy, DefaultScreen(ctx->dpy), &n_fbc);

  if (fbc)
  {
    if (!verbose)
    {
      /* print table header */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      /* loop through all the fbcs */
      for (i=0; i<n_fbc; i++)
      {
        /* print out the information for this fbc */
        /* visual id */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FBCONFIG_ID, &value);
        if (ret != Success)
        {
          fprintf(file, "|  ?  |");
        }
        else
        {
          fprintf(file, " |% 4d | ", value);
        }
        /* visual type */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DRAWABLE_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value & GLX_WINDOW_BIT)
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "wp ");
            }
            else
            {
              fprintf(file, "wn ");
            }
          }
          else
          {
            if (value & GLX_PBUFFER_BIT)
            {
              fprintf(file, "pb ");
            }
            else if (value & GLX_PIXMAP_BIT)
            {
              fprintf(file, "pm ");
            }
            else
            {
              fprintf(file, " ? ");
            }
          }
        }
        /* x renderable */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_RENDERABLE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, value ? " y " : " n ");
        }
        /* class */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_X_VISUAL_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLX_TRUE_COLOR == value)
            fprintf(file, "tc ");
          else if (GLX_DIRECT_COLOR == value)
            fprintf(file, "dc ");
          else if (GLX_PSEUDO_COLOR == value)
            fprintf(file, "pc ");
          else if (GLX_STATIC_COLOR == value)
            fprintf(file, "sc ");
          else if (GLX_GRAY_SCALE == value)
            fprintf(file, "gs ");
          else if (GLX_STATIC_GRAY == value)
            fprintf(file, "sg ");
          else if (GLX_X_VISUAL_TYPE == value)
            fprintf(file, " . ");
          else
            fprintf(file, " ? ");
        }
        /* format */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RENDER_TYPE, &value);
        if (ret != Success)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (GLXEW_NV_float_buffer)
          {
            int ret2, value2;
            ret2 = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_FLOAT_COMPONENTS_NV, &value2);
            if (Success == ret2 && GL_TRUE == value2)
            {
              fprintf(file, " f ");
            }
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
          else
          {
            if (value & GLX_RGBA_FLOAT_ATI_BIT)
              fprintf(file, " f ");
            else if (value & GLX_RGBA_BIT)
              fprintf(file, " i ");
            else if (value & GLX_COLOR_INDEX_BIT)
              fprintf(file, " c ");
            else
              fprintf(file, " ? ");
          }
        }
        /* double buffer */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DOUBLEBUFFER, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* stereo */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STEREO, &value);
        fprintf(file, " %c ", Success != ret ? '?' : (value ? 'y' : '.'));
        /* level */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_LEVEL, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        /* transparency */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_TRANSPARENT_TYPE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (GLX_TRANSPARENT_RGB == value)
            fprintf(file, " r | ");
          else if (GLX_TRANSPARENT_INDEX == value)
            fprintf(file, " i | ");
          else if (GLX_NONE == value)
            fprintf(file, " . | ");
          else
            fprintf(file, " ? | ");
        }
        /* color size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BUFFER_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, "  ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%3d ", value);
          else
            fprintf(file, "  . ");
        }
        /* red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* aux buffers */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_AUX_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* depth size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_DEPTH_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* stencil size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_STENCIL_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* accum red size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_RED_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum green size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_GREEN_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum blue size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_BLUE_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d ", value);
          else
            fprintf(file, " . ");
        }
        /* accum alpha size */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_ACCUM_ALPHA_SIZE, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          if (value)
            fprintf(file, "%2d | ", value);
          else
            fprintf(file, " . | ");
        }
        /* multisample */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLES, &value);
        if (Success != ret)
        {
          fprintf(file, " ? ");
        }
        else
        {
          fprintf(file, "%2d ", value);
        }
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_SAMPLE_BUFFERS, &value);
        if (Success != ret)
        {
          fprintf(file, " ? | ");
        }
        else
        {
          fprintf(file, "%2d | ", value);
        }
        /* caveat */
        ret = glXGetFBConfigAttrib(ctx->dpy, fbc[i], GLX_CONFIG_CAVEAT, &value);
        if (Success != ret)
        {
          fprintf(file, "???? |");
        }
        else
        {
          if (GLX_NONE == value)
            fprintf(file, "none |\n");
          else if (GLX_SLOW_CONFIG == value)
            fprintf(file, "slow |\n");
          else if (GLX_NON_CONFORMANT_CONFIG == value)
            fprintf(file, "ncft |\n");
          else
            fprintf(file, "???? |\n");
        }
      }
      /* print table footer */
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
      fprintf(file, " |  id | tp xr cl fm db st lv xp |  sz  r  g  b  a | bf th cl | r  g  b  a  | ns  b |  eat |\n");
      fprintf(file, " |     |        visual           |      color      | ax dp st |    accum    |   ms  |  cav |\n");
      fprintf(file, " +-----+-------------------------+-----------------+----------+-------------+-------+------+\n");
    }
  }
}